

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O1

bool __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::
optimizeSetIfWithCopyArm(wasm::Expression___(void *this,Expression **currp)

{
  Expression **currp_00;
  LocalSet *this_00;
  Expression *pEVar1;
  bool bVar2;
  Block *this_01;
  Expression *item;
  bool bVar3;
  Builder local_48;
  Builder builder;
  
  this_00 = (LocalSet *)*currp;
  if ((this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
      LocalSetId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
  }
  this_01 = (Block *)this_00->value;
  if ((((((SpecificExpression<(wasm::Expression::Id)2> *)
         &this_01->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id == IfId
       ) && (1 < (((SpecificExpression<(wasm::Expression::Id)2> *)
                  &this_01->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).
                 type.id)) &&
     (1 < (((Expression *)(this_01->name).super_IString.str._M_len)->type).id)) {
    local_48.wasm = *(Module **)((long)this + 0xd0);
    pEVar1 = (Expression *)(this_01->name).super_IString.str._M_str;
    item = (Expression *)0x0;
    if (pEVar1->_id == LocalGetId) {
      item = pEVar1;
    }
    builder.wasm = (Module *)this;
    if ((item == (Expression *)0x0) || (item[1]._id != this_00->index)) {
      pEVar1 = (Expression *)
               (this_01->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      if (pEVar1->_id == LocalGetId) {
        item = (Expression *)0x0;
        if (pEVar1[1]._id == this_00->index) {
          item = pEVar1;
        }
      }
      else {
        item = (Expression *)0x0;
      }
    }
    else {
      Builder::flip(&local_48,(If *)this_01);
    }
    bVar3 = item != (Expression *)0x0;
    if (bVar3) {
      bVar2 = LocalSet::isTee(this_00);
      if (this_00->index != item[1]._id) {
        __assert_fail("set->index == get->index",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                      ,0x521,
                      "bool wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::optimizeSetIfWithCopyArm(Expression **)"
                     );
      }
      if ((Expression *)
          (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
          .data != item) {
        __assert_fail("iff->ifFalse == get",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                      ,0x522,
                      "bool wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::optimizeSetIfWithCopyArm(Expression **)"
                     );
      }
      currp_00 = (Expression **)&(this_01->name).super_IString.str._M_str;
      this_00->value = (Expression *)(this_01->name).super_IString.str._M_str;
      LocalSet::finalize(this_00);
      (this_01->name).super_IString.str._M_str = (char *)this_00;
      (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      If::finalize((If *)this_01);
      if (bVar2) {
        LocalSet::makeSet(this_00);
        this_01 = Builder::makeBlock(&local_48,(Expression *)this_01);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(this_01->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,item)
        ;
        Block::finalize(this_01);
      }
      *currp = (Expression *)this_01;
      bVar2 = optimizeSetIfWithBrArm(wasm::Expression___(builder.wasm,currp_00);
      if (!bVar2) {
        Expression___(builder.wasm,currp_00);
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool optimizeSetIfWithCopyArm(Expression** currp) {
        auto* set = (*currp)->cast<LocalSet>();
        auto* iff = set->value->dynCast<If>();
        if (!iff || !iff->type.isConcrete() ||
            !iff->condition->type.isConcrete()) {
          return false;
        }
        Builder builder(*getModule());
        LocalGet* get = iff->ifTrue->dynCast<LocalGet>();
        if (get && get->index == set->index) {
          builder.flip(iff);
        } else {
          get = iff->ifFalse->dynCast<LocalGet>();
          if (get && get->index != set->index) {
            get = nullptr;
          }
        }
        if (!get) {
          return false;
        }
        // We can do it!
        bool tee = set->isTee();
        assert(set->index == get->index);
        assert(iff->ifFalse == get);
        set->value = iff->ifTrue;
        set->finalize();
        iff->ifTrue = set;
        iff->ifFalse = nullptr;
        iff->finalize();
        Expression* replacement = iff;
        if (tee) {
          set->makeSet();
          // We need a block too.
          replacement = builder.makeSequence(iff,
                                             get // reuse the get
          );
        }
        *currp = replacement;
        // Recurse on the set, which now has a new value.
        optimizeSetIf(&iff->ifTrue);
        return true;
      }